

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::eliminateEpsilonProductions(CFG *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  size_type sVar4;
  reference ppPVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  const_reference __lhs;
  __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
  local_d8;
  __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
  local_d0;
  const_iterator local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int i_1;
  int local_98;
  int local_94;
  int i;
  int pSize;
  string symbol;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nullableSymbols;
  CFG *this_local;
  
  nullableSymbols.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  memset(local_28,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  do {
    bVar1 = expandNullableSymbols
                      (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_28);
  } while (bVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Nullable symbols: ");
  vecToStr((string *)&__range1,this,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  poVar2 = std::operator<<(poVar2,(string *)&__range1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
  symbol.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&symbol.field_2 + 8));
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_28);
      return;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&i,(string *)pbVar3);
    sVar4 = std::vector<Production_*,_std::allocator<Production_*>_>::size(&this->productionsP);
    local_94 = (int)sVar4;
    for (local_98 = 0; local_98 < local_94; local_98 = local_98 + 1) {
      std::__cxx11::string::string((string *)local_b8,(string *)&i);
      ppPVar5 = std::vector<Production_*,_std::allocator<Production_*>_>::operator[]
                          (&this->productionsP,(long)local_98);
      removeNullableSymbol(this,(string *)local_b8,*ppPVar5);
      std::__cxx11::string::~string((string *)local_b8);
    }
    for (local_bc = 0; uVar6 = (ulong)local_bc,
        sVar4 = std::vector<Production_*,_std::allocator<Production_*>_>::size(&this->productionsP),
        uVar6 < sVar4; local_bc = local_bc + 1) {
      ppPVar5 = std::vector<Production_*,_std::allocator<Production_*>_>::operator[]
                          (&this->productionsP,(long)local_bc);
      pvVar7 = Production::getToP_abi_cxx11_(*ppPVar5);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvVar7);
      if (bVar1) {
LAB_001351dc:
        local_d8._M_current =
             (Production **)
             std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
        local_d0 = __gnu_cxx::
                   __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                   ::operator+(&local_d8,(long)local_bc);
        __gnu_cxx::
        __normal_iterator<Production*const*,std::vector<Production*,std::allocator<Production*>>>::
        __normal_iterator<Production**>
                  ((__normal_iterator<Production*const*,std::vector<Production*,std::allocator<Production*>>>
                    *)&local_c8,&local_d0);
        std::vector<Production_*,_std::allocator<Production_*>_>::erase
                  (&this->productionsP,local_c8);
        local_bc = local_bc + -1;
      }
      else {
        ppPVar5 = std::vector<Production_*,_std::allocator<Production_*>_>::operator[]
                            (&this->productionsP,(long)local_bc);
        pvVar7 = Production::getToP_abi_cxx11_(*ppPVar5);
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar7);
        if (sVar4 == 1) {
          ppPVar5 = std::vector<Production_*,_std::allocator<Production_*>_>::operator[]
                              (&this->productionsP,(long)local_bc);
          pvVar7 = Production::getToP_abi_cxx11_(*ppPVar5);
          __lhs = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](pvVar7,0);
          bVar1 = std::operator==(__lhs,"e");
          if (bVar1) goto LAB_001351dc;
        }
      }
    }
    std::__cxx11::string::~string((string *)&i);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void CFG::eliminateEpsilonProductions() {
    std::vector<std::string> nullableSymbols = {};
    while (expandNullableSymbols(nullableSymbols)) {}

    std::cout << "Nullable symbols: " << vecToStr(nullableSymbols) << std::endl;

    for (std::string symbol: nullableSymbols) {
        int pSize = productionsP.size();
        for (int i = 0; i < pSize; ++i) {
            removeNullableSymbol(symbol, productionsP[i]);
        }

        for (int i = 0; i < productionsP.size(); ++i) {
            if (productionsP[i]->getToP().empty() or
                (productionsP[i]->getToP().size() == 1 and
                 productionsP[i]->getToP()[0] == "e")) {
                // Transition A -> e
                productionsP.erase(productionsP.begin() + i);
                i--;
            }
        }
    }
}